

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plain_fkhash_trie.hpp
# Opt level: O0

void __thiscall
poplar::plain_fkhash_trie<90U,_poplar::hash::vigna_hasher>::plain_fkhash_trie
          (plain_fkhash_trie<90U,_poplar::hash::vigna_hasher> *this,uint32_t capa_bits,
          uint32_t symb_bits)

{
  undefined1 auVar1 [16];
  uint *puVar2;
  uint64_t uVar3;
  undefined8 uVar4;
  uint32_t in_EDX;
  uint64_t in_RDI;
  size_p2 *this_00;
  undefined1 auVar5 [16];
  compact_vector *in_stack_ffffffffffffff08;
  compact_vector *in_stack_ffffffffffffff10;
  compact_vector *this_01;
  uint32_t width;
  uint64_t size;
  compact_vector *in_stack_ffffffffffffff60;
  compact_vector local_70;
  size_p2 local_40 [2];
  size_p2 local_20;
  uint32_t local_10;
  uint local_c [3];
  
  size = in_RDI;
  local_10 = in_EDX;
  compact_vector::compact_vector(in_stack_ffffffffffffff10);
  width = (uint32_t)(size + 0x30 >> 0x20);
  compact_vector::compact_vector(in_stack_ffffffffffffff10);
  *(undefined8 *)(size + 0x60) = 0;
  *(undefined8 *)(size + 0x68) = 0;
  size_p2::size_p2((size_p2 *)(size + 0x70));
  size_p2::size_p2((size_p2 *)(size + 0x80));
  puVar2 = std::max<unsigned_int>(&min_capa_bits,local_c);
  size_p2::size_p2(&local_20,*puVar2);
  *(undefined8 *)(in_RDI + 0x70) = local_20._0_8_;
  *(uint64_t *)(in_RDI + 0x78) = local_20.mask_;
  size_p2::size_p2(local_40,local_10);
  *(size_p2 *)(in_RDI + 0x80) = local_40[0];
  this_00 = (size_p2 *)(in_RDI + 0x70);
  uVar3 = size_p2::size(this_00);
  auVar1 = vcvtusi2sd_avx512f((undefined1  [16])local_40[0],uVar3 * 0x5a);
  auVar5._0_8_ = auVar1._0_8_ / 100.0;
  auVar5._8_8_ = auVar1._8_8_;
  uVar4 = vcvttsd2usi_avx512f(auVar5);
  *(undefined8 *)(in_RDI + 0x68) = uVar4;
  size_p2::size(this_00);
  size_p2::bits(this_00);
  size_p2::bits((size_p2 *)(in_RDI + 0x80));
  compact_vector::compact_vector(in_stack_ffffffffffffff60,size,width);
  this_01 = &local_70;
  compact_vector::operator=(this_01,in_stack_ffffffffffffff08);
  compact_vector::~compact_vector((compact_vector *)0x21a70e);
  size_p2::size((size_p2 *)(in_RDI + 0x70));
  size_p2::bits((size_p2 *)(in_RDI + 0x70));
  compact_vector::compact_vector(in_stack_ffffffffffffff60,size,width);
  compact_vector::operator=(this_01,in_stack_ffffffffffffff08);
  compact_vector::~compact_vector((compact_vector *)0x21a760);
  return;
}

Assistant:

plain_fkhash_trie(uint32_t capa_bits, uint32_t symb_bits) {
        capa_size_ = size_p2{std::max(min_capa_bits, capa_bits)};
        symb_size_ = size_p2{symb_bits};
        max_size_ = static_cast<uint64_t>(capa_size_.size() * MaxFactor / 100.0);
        table_ = compact_vector{capa_size_.size(), capa_size_.bits() + symb_size_.bits()};
        ids_ = compact_vector{capa_size_.size(), capa_size_.bits()};
    }